

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O3

void Mfs_ManStop(Mfs_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int *piVar4;
  Vec_Vec_t *__ptr;
  void **ppvVar5;
  int iVar6;
  long lVar7;
  
  if (p->pPars->fVerbose != 0) {
    Mfs_ManPrint(p);
  }
  pVVar1 = p->vTruth;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  if (p->pManDec != (Bdc_Man_t *)0x0) {
    Bdc_ManFree(p->pManDec);
  }
  if (p->pCare != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pCare);
  }
  pVVar2 = p->vSuppsInv;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar6 = pVVar2->nSize;
    if (0 < iVar6) {
      lVar7 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar7];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar6 = pVVar2->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
    }
    free(pVVar2);
  }
  pVVar1 = p->vProbs;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  Mfs_ManClean(p);
  Int_ManFree(p->pMan);
  pVVar1 = p->vMem;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  __ptr = p->vLevels;
  iVar6 = __ptr->nSize;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      pvVar3 = __ptr->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar6 = __ptr->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  pVVar2 = p->vMfsFanins;
  ppvVar5 = pVVar2->pArray;
  if (ppvVar5 != (void **)0x0) {
    free(ppvVar5);
  }
  free(pVVar2);
  pVVar1 = p->vProjVarsCnf;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  pVVar1 = p->vProjVarsSat;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  pVVar1 = p->vDivLits;
  piVar4 = pVVar1->pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(pVVar1);
  pVVar2 = p->vDivCexes;
  ppvVar5 = pVVar2->pArray;
  if (ppvVar5 != (void **)0x0) {
    free(ppvVar5);
  }
  free(pVVar2);
  free(p);
  return;
}

Assistant:

void Mfs_ManStop( Mfs_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Mfs_ManPrint( p );
    if ( p->vTruth )
        Vec_IntFree( p->vTruth );
    if ( p->pManDec )
        Bdc_ManFree( p->pManDec );
    if ( p->pCare )
        Aig_ManStop( p->pCare );
    if ( p->vSuppsInv )
        Vec_VecFree( (Vec_Vec_t *)p->vSuppsInv );
    if ( p->vProbs )
        Vec_IntFree( p->vProbs );
    Mfs_ManClean( p );
    Int_ManFree( p->pMan );
    Vec_IntFree( p->vMem );
    Vec_VecFree( p->vLevels );
    Vec_PtrFree( p->vMfsFanins );
    Vec_IntFree( p->vProjVarsCnf );
    Vec_IntFree( p->vProjVarsSat );
    Vec_IntFree( p->vDivLits );
    Vec_PtrFree( p->vDivCexes );
    ABC_FREE( p );
}